

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
ChebTools::ChebyshevExpansion::real_roots_intervals
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
          *segments,bool only_in_domain)

{
  pointer pCVar1;
  pointer this;
  vector<double,_std::allocator<double>_> segroots;
  _Vector_base<double,_std::allocator<double>_> local_40;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar1 = (segments->
           super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (this = (segments->
              super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
              )._M_impl.super__Vector_impl_data._M_start; this != pCVar1; this = this + 1) {
    real_roots((vector<double,_std::allocator<double>_> *)&local_40,this,only_in_domain);
    std::vector<double,std::allocator<double>>::
    insert<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
              ((vector<double,std::allocator<double>> *)__return_storage_ptr__,
               (const_iterator)
               (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               local_40._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               local_40._M_impl.super__Vector_impl_data._M_finish);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> ChebyshevExpansion::real_roots_intervals(const std::vector<ChebyshevExpansion> &segments, bool only_in_domain) {
        std::vector<double> roots;
        for (auto &seg : segments) {
            const auto segroots = seg.real_roots(only_in_domain);
            roots.insert(roots.end(), segroots.cbegin(), segroots.cend());
        }
        return roots;
    }